

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void __thiscall QCborContainerPrivate::~QCborContainerPrivate(QCborContainerPrivate *this)

{
  bool bVar1;
  QCborContainerPrivate *this_00;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  Element *e;
  QList<QtCbor::Element> *__range1;
  iterator __end1;
  iterator __begin1;
  QList<QtCbor::Element> *in_stack_ffffffffffffffc0;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_24;
  Element *local_20;
  iterator local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (Element *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QtCbor::Element>::begin(in_stack_ffffffffffffffc0);
  local_18.i = (Element *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = QList<QtCbor::Element>::end(in_stack_ffffffffffffffc0);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<QtCbor::Element>::iterator::operator!=(&local_10,local_18);
    if (!bVar1) break;
    this_00 = (QCborContainerPrivate *)QList<QtCbor::Element>::iterator::operator*(&local_10);
    local_24.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorage<QtCbor::Element::ValueFlag>)
         QFlags<QtCbor::Element::ValueFlag>::operator&
                   ((QFlags<QtCbor::Element::ValueFlag> *)this_00,(ValueFlag)((ulong)in_RDI >> 0x20)
                   );
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_24);
    if (bVar1) {
      deref(this_00);
    }
    QList<QtCbor::Element>::iterator::operator++(&local_10);
  }
  QList<QtCbor::Element>::~QList((QList<QtCbor::Element> *)0x21b4de);
  QByteArray::~QByteArray((QByteArray *)0x21b4eb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QCborContainerPrivate::~QCborContainerPrivate()
{
    // delete our elements
    for (Element &e : elements) {
        if (e.flags & Element::IsContainer)
            e.container->deref();
    }
}